

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PyCode.cc
# Opt level: O2

int __thiscall PyCode::generateMFStructPy(PyCode *this,string *cwd)

{
  char cVar1;
  undefined8 *puVar2;
  string path;
  ofstream ofs;
  
  std::ofstream::ofstream(&ofs);
  std::operator+(&path,cwd,"/MFStruct.py");
  std::ofstream::open((string *)&ofs,(_Ios_Openmode)&path);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    std::operator<<((ostream *)&ofs,"import json\n");
    std::operator<<((ostream *)&ofs,"from collections import defaultdict\n");
    std::operator<<((ostream *)&ofs,"\n");
    std::operator<<((ostream *)&ofs,"class operateClass():\n");
    std::operator<<((ostream *)&ofs,
                    "\tagg_func_enum = (\"sum\", \"max\", \"min\", \"count\", \"avg\")\n");
    std::operator<<((ostream *)&ofs,
                    "\tdef __init__(self, selectAttr : str, havingCond : str, size : int, group_attr, agg_func, select_cond):\n"
                   );
    std::operator<<((ostream *)&ofs,"\t\tself.select_attr_agg_func = selectAttr.split(\", \")\n");
    std::operator<<((ostream *)&ofs,"\t\tself.select_attr_parsed = []\n");
    std::operator<<((ostream *)&ofs,"\t\tself.having_conds = havingCond\n");
    std::operator<<((ostream *)&ofs,"\t\tself.group_attr = group_attr\n");
    std::operator<<((ostream *)&ofs,"\t\tself.agg_func = agg_func\n");
    std::operator<<((ostream *)&ofs,"\t\tself.agg_func_parsed = defaultdict(str)\n");
    std::operator<<((ostream *)&ofs,"\t\tself.select_conds = select_cond\n");
    std::operator<<((ostream *)&ofs,"\t\tself.part_size = size\n");
    std::operator<<((ostream *)&ofs,"\n");
    std::operator<<((ostream *)&ofs,"\tdef parse_agg_group(self):\n");
    std::operator<<((ostream *)&ofs,"\t\tfor var_name, func_name in self.agg_func.items():\n");
    std::operator<<((ostream *)&ofs,
                    "\t\t\tself.agg_func_parsed[var_name] = self.parse_agg_func(func_name)\n");
    std::operator<<((ostream *)&ofs,"\n");
    std::operator<<((ostream *)&ofs,"\t@staticmethod\n");
    std::operator<<((ostream *)&ofs,"\tdef parse_agg_func(unparsed_agg_func):\n");
    std::operator<<((ostream *)&ofs,"\t\t\'\'\'\n");
    std::operator<<((ostream *)&ofs,"\t\t\t@input: sum_varname\n");
    std::operator<<((ostream *)&ofs,"\t\t\t@param: unparsed_agg_func : str\n");
    std::operator<<((ostream *)&ofs,"\t\t\t@return: {sum(varname) : 0} : dict\n");
    std::operator<<((ostream *)&ofs,"\t\t\'\'\'\n");
    std::operator<<((ostream *)&ofs,"\t\tparsed_func = []\n");
    std::operator<<((ostream *)&ofs,"\t\tfor item in unparsed_agg_func:\n");
    std::operator<<((ostream *)&ofs,"\t\t\tfuc_lst = item.split(\'_\')\n");
    std::operator<<((ostream *)&ofs,"\t\t\tif len(fuc_lst) == 3:\n");
    std::operator<<((ostream *)&ofs,"\t\t\t\tif fuc_lst[1] in operateClass.agg_func_enum:\n");
    std::operator<<((ostream *)&ofs,
                    "\t\t\t\t\tparsed_func.append(fuc_lst[1] + \'(\' + fuc_lst[2] + \')\')\n");
    std::operator<<((ostream *)&ofs,"\t\t\t\telse:\n");
    std::operator<<((ostream *)&ofs,
                    "\t\t\t\t\traise(TypeError(\"Cannot find this aggregate functions in SQL standards.\"))\n"
                   );
    std::operator<<((ostream *)&ofs,"\t\t\tif len(fuc_lst) == 2:\n");
    std::operator<<((ostream *)&ofs,"\t\t\t\tif fuc_lst[0] in operateClass.agg_func_enum:\n");
    std::operator<<((ostream *)&ofs,
                    "\t\t\t\t\tparsed_func.append(fuc_lst[0] + \'(\' + fuc_lst[1] + \')\')\n");
    std::operator<<((ostream *)&ofs,"\t\t\t\telse:\n");
    std::operator<<((ostream *)&ofs,
                    "\t\t\t\t\traise(TypeError(\"Cannot find this aggregate functions in SQL standards.\"))\n"
                   );
    std::operator<<((ostream *)&ofs,"\t\treturn parsed_func\n");
    std::operator<<((ostream *)&ofs,"\n");
    std::operator<<((ostream *)&ofs,"\tdef parse_select_attr(self):\n");
    std::operator<<((ostream *)&ofs,"\t\tfor item in self.select_attr_agg_func:\n");
    std::operator<<((ostream *)&ofs,"\t\t\tif item in self.group_attr:\n");
    std::operator<<((ostream *)&ofs,"\t\t\t\tself.select_attr_parsed.append(item)\n");
    std::operator<<((ostream *)&ofs,"\t\t\telse:\n");
    std::operator<<((ostream *)&ofs,"\t\t\t\ttmp = item.split(\"_\")\n");
    std::operator<<((ostream *)&ofs,
                    "\t\t\t\tself.select_attr_parsed.append(tmp[1] + \"({}.{})\".format(tmp[0], tmp[2]))\n"
                   );
    std::operator<<((ostream *)&ofs,"\n");
    std::operator<<((ostream *)&ofs,"class MFTable():\n");
    std::operator<<((ostream *)&ofs,"\tdef __init__(self, attr_lst : list, agg_lst : list = []):\n")
    ;
    std::operator<<((ostream *)&ofs,"\t\tself.group_attr = dict.fromkeys(attr_lst, 0)\n");
    std::operator<<((ostream *)&ofs,"\t\tself.agg_func = defaultdict(int)\n");
    std::ios::clear((int)(ostream *)&ofs + (int)*(undefined8 *)(_ofs + -0x18));
    std::ofstream::close();
    std::__cxx11::string::~string((string *)&path);
    std::ofstream::~ofstream(&ofs);
    return 0;
  }
  std::ios::clear((int)(string *)&ofs + (int)*(undefined8 *)(_ofs + -0x18));
  std::ofstream::close();
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = &PTR__exception_00115d88;
  __cxa_throw(puVar2,&ParserClassException::FileNotOpenException::typeinfo,
              std::exception::~exception);
}

Assistant:

int PyCode::generateMFStructPy(std::string cwd) throw()
{
    std::ofstream ofs;
    std::string path = cwd + "/MFStruct.py";
    ofs.open(path, std::ios::out);
    if (!ofs.is_open())
    {
        ofs.clear();
        ofs.close();
        throw ParserClassException::FileNotOpenException();
    }
    else
    {
        ofs << "import json\n";
        ofs << "from collections import defaultdict\n";
        ofs << "\n";
        ofs << "class operateClass():\n";
        ofs << "\tagg_func_enum = (\"sum\", \"max\", \"min\", \"count\", \"avg\")\n";
        ofs << "\tdef __init__(self, selectAttr : str, havingCond : str, size : int, group_attr, agg_func, select_cond):\n";
        ofs << "\t\tself.select_attr_agg_func = selectAttr.split(\", \")\n";
        ofs << "\t\tself.select_attr_parsed = []\n";
        ofs << "\t\tself.having_conds = havingCond\n";
        ofs << "\t\tself.group_attr = group_attr\n";
        ofs << "\t\tself.agg_func = agg_func\n";
        ofs << "\t\tself.agg_func_parsed = defaultdict(str)\n";
        ofs << "\t\tself.select_conds = select_cond\n";
        ofs << "\t\tself.part_size = size\n";
        ofs << "\n";
        ofs << "\tdef parse_agg_group(self):\n";
        ofs << "\t\tfor var_name, func_name in self.agg_func.items():\n";
        ofs << "\t\t\tself.agg_func_parsed[var_name] = self.parse_agg_func(func_name)\n";
        ofs << "\n";
        ofs << "\t@staticmethod\n";
        ofs << "\tdef parse_agg_func(unparsed_agg_func):\n";
        ofs << "\t\t\'\'\'\n";
        ofs << "\t\t\t@input: sum_varname\n";
        ofs << "\t\t\t@param: unparsed_agg_func : str\n";
        ofs << "\t\t\t@return: {sum(varname) : 0} : dict\n";
        ofs << "\t\t\'\'\'\n";
        ofs << "\t\tparsed_func = []\n";
        ofs << "\t\tfor item in unparsed_agg_func:\n";
        ofs << "\t\t\tfuc_lst = item.split('_')\n";
        ofs << "\t\t\tif len(fuc_lst) == 3:\n";
        ofs << "\t\t\t\tif fuc_lst[1] in operateClass.agg_func_enum:\n";
        ofs << "\t\t\t\t\tparsed_func.append(fuc_lst[1] + \'(\' + fuc_lst[2] + \')\')\n";
        ofs << "\t\t\t\telse:\n";
        ofs << "\t\t\t\t\traise(TypeError(\"Cannot find this aggregate functions in SQL standards.\"))\n";
        ofs << "\t\t\tif len(fuc_lst) == 2:\n";
        ofs << "\t\t\t\tif fuc_lst[0] in operateClass.agg_func_enum:\n";
        ofs << "\t\t\t\t\tparsed_func.append(fuc_lst[0] + \'(\' + fuc_lst[1] + \')\')\n";
        ofs << "\t\t\t\telse:\n";
        ofs << "\t\t\t\t\traise(TypeError(\"Cannot find this aggregate functions in SQL standards.\"))\n";
        ofs << "\t\treturn parsed_func\n";
        ofs << "\n";
        ofs << "\tdef parse_select_attr(self):\n";
        ofs << "\t\tfor item in self.select_attr_agg_func:\n";
        ofs << "\t\t\tif item in self.group_attr:\n";
        ofs << "\t\t\t\tself.select_attr_parsed.append(item)\n";
        ofs << "\t\t\telse:\n";
        ofs << "\t\t\t\ttmp = item.split(\"_\")\n";
        ofs << "\t\t\t\tself.select_attr_parsed.append(tmp[1] + \"({}.{})\".format(tmp[0], tmp[2]))\n";
        ofs << "\n";
        ofs << "class MFTable():\n";
        ofs << "\tdef __init__(self, attr_lst : list, agg_lst : list = []):\n";
        ofs << "\t\tself.group_attr = dict.fromkeys(attr_lst, 0)\n";
        ofs << "\t\tself.agg_func = defaultdict(int)\n";
        ofs.clear();
        ofs.close();
    }
    return 0;
}